

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O1

void __thiscall HawkTracer::client::Converter::Converter(Converter *this)

{
  TracepointMap *pTVar1;
  
  this->_vptr_Converter = (_func_int **)&PTR__Converter_00117bc8;
  pTVar1 = (TracepointMap *)operator_new(0x38);
  (pTVar1->_input_map)._M_h._M_buckets = 0;
  *(size_type *)((long)&(pTVar1->_input_map)._M_h + 8) = 0;
  *(undefined8 *)((long)&(pTVar1->_input_map)._M_h + 0x20) = 0;
  *(size_t *)((long)&(pTVar1->_input_map)._M_h + 0x28) = 0;
  ((__node_base *)((long)&(pTVar1->_input_map)._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
  *(size_type *)((long)&(pTVar1->_input_map)._M_h + 0x18) = 0;
  *(__node_base_ptr *)((long)&(pTVar1->_input_map)._M_h + 0x30) = (__node_base_ptr)0x0;
  (pTVar1->_input_map)._M_h._M_buckets =
       (__node_base_ptr *)((long)&(pTVar1->_input_map)._M_h + 0x30);
  *(size_type *)((long)&(pTVar1->_input_map)._M_h + 8) = 1;
  ((_Prime_rehash_policy *)((long)&(pTVar1->_input_map)._M_h + 0x20))->_M_max_load_factor = 1.0;
  *(size_t *)((long)&(pTVar1->_input_map)._M_h + 0x28) = 0;
  *(__node_base_ptr *)((long)&(pTVar1->_input_map)._M_h + 0x30) = (__node_base_ptr)0x0;
  (this->_tracepoint_map)._M_t.
  super___uniq_ptr_impl<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_HawkTracer::client::TracepointMap_*,_std::default_delete<HawkTracer::client::TracepointMap>_>
  .super__Head_base<0UL,_HawkTracer::client::TracepointMap_*,_false>._M_head_impl = pTVar1;
  (this->_mapping_klass_name)._M_dataplus._M_p = (pointer)&(this->_mapping_klass_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->_mapping_klass_name,"HT_StringMappingEvent","");
  this->_mapping_klass_id = 0;
  return;
}

Assistant:

Converter::Converter() :
    _tracepoint_map(HawkTracer::parser::make_unique<TracepointMap>()),
    _mapping_klass_name("HT_StringMappingEvent")
{
}